

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
cs::method_for::preprocess
          (method_for *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  int iVar1;
  const_reference pptVar2;
  token_base **pptVar3;
  undefined8 uVar4;
  size_type sVar5;
  compile_error *this_00;
  element_type *this_01;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *parallel_list;
  tree_type<cs::token_base_*> *tree;
  bool in_stack_00000146;
  bool in_stack_00000147;
  instance_type *in_stack_00000148;
  iterator in_stack_00000150;
  string *in_stack_fffffffffffffef8;
  internal_error *in_stack_ffffffffffffff00;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_ffffffffffffff10;
  allocator local_c1;
  iterator *in_stack_ffffffffffffff40;
  allocator local_89;
  string local_88 [32];
  tree_node *local_68;
  undefined1 local_5d;
  allocator local_49;
  string local_48 [32];
  tree_node *local_28;
  tree_type<cs::token_base_*> *local_20;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_ffffffffffffff10);
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
  local_20 = token_expr::get_tree((token_expr *)*pptVar2);
  local_28 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffef8);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff40);
  if (*pptVar3 == (token_base *)0x0) {
    local_5d = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Null pointer accessed.",&local_49);
    internal_error::internal_error(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_5d = 0;
    __cxa_throw(uVar4,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_68 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffef8);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff40);
  iVar1 = (*(*pptVar3)->_vptr_token_base[2])();
  if (iVar1 != 0xf) {
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,
               "Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>",
               &local_89);
    compile_error::compile_error
              ((compile_error *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
  }
  tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffef8);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff40);
  token_parallel::get_parallel((token_parallel *)*pptVar3);
  sVar5 = std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                  *)0x5664c1);
  if (sVar5 != 3) {
    this_00 = (compile_error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff40,
               "Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>",
               &local_c1);
    compile_error::compile_error(this_00,in_stack_fffffffffffffef8);
    __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
  }
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x566597);
  this_01 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x5665a3);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  operator[]((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
              *)in_stack_ffffffffffffff00,(size_type)this_01);
  tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)this_01);
  instance_type::check_define_var
            (in_stack_00000148,in_stack_00000150,in_stack_00000147,in_stack_00000146);
  return;
}

Assistant:

void method_for::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (tree.root().data()->get_type() != token_types::parallel)
			throw compile_error("Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>");
		auto &parallel_list = static_cast<token_parallel *>(tree.root().data())->get_parallel();
		if (parallel_list.size() != 3)
			throw compile_error("Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>");
		context->instance->check_define_var(parallel_list[0].root(), true);
	}